

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

void __thiscall wasm::PassRunner::run(PassRunner *this)

{
  PassRunner **ppPVar1;
  Pass *pPVar2;
  pointer puVar3;
  Function *func;
  int iVar4;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass;
  pointer puVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  PassOptions *pPVar10;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass_1;
  pointer puVar11;
  PassOptions *pPVar12;
  iterator __begin2;
  pointer puVar13;
  iterator __end2;
  char *pcVar14;
  pointer puVar15;
  ulong uVar16;
  bool bVar17;
  string_view sVar18;
  undefined1 auStack_398 [8];
  stringstream moduleBefore;
  long local_388 [14];
  ios_base local_318 [264];
  undefined1 local_210 [8];
  anon_class_16_2_032a43cd flush;
  _Head_base<0UL,_wasm::Pass_*,_false> local_88;
  long local_80;
  double local_68;
  pointer local_60;
  char *local_58;
  long local_50;
  double local_48;
  PassOptions *local_40;
  PassRunner *local_38;
  
  if (run()::passDebug == '\0') {
    run();
  }
  bVar9 = run::passDebug == 2 | (this->options).debug;
  pPVar10 = (PassOptions *)(ulong)bVar9;
  local_38 = this;
  if (bVar9 == 1) {
    bVar9 = this->isNested;
  }
  else {
    if ((run::passDebug == 0) || (this->isNested != false)) {
      local_210 = (undefined1  [8])auStack_398;
      auStack_398 = (undefined1  [8])0x0;
      _moduleBefore = 0;
      local_388[0] = 0;
      puVar11 = (this->passes).
                super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar15 = (this->passes).
                super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      flush.stack = (vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)this;
      if (puVar11 != puVar15) {
        do {
          iVar4 = (*((puVar11->_M_t).
                     super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                     super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[4])();
          if ((char)iVar4 == '\0') {
            run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)local_210);
            runPass(local_38,(puVar11->_M_t).
                             super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                             super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl);
          }
          else {
            local_88._M_head_impl =
                 (puVar11->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                 ._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
            std::vector<wasm::Pass*,std::allocator<wasm::Pass*>>::emplace_back<wasm::Pass*>
                      ((vector<wasm::Pass*,std::allocator<wasm::Pass*>> *)auStack_398,
                       &local_88._M_head_impl);
          }
          puVar11 = puVar11 + 1;
        } while (puVar11 != puVar15);
      }
      run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)local_210);
      if (auStack_398 == (undefined1  [8])0x0) {
        return;
      }
      operator_delete((void *)auStack_398,local_388[0] - (long)auStack_398);
      return;
    }
    bVar9 = 0;
  }
  pcVar14 = "passes";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[PassRunner] running ",0x15);
  bVar17 = (bVar9 & 1) != 0;
  if (bVar17) {
    pcVar14 = "nested passes";
  }
  local_50 = 6;
  if (bVar17) {
    local_50 = 0xd;
  }
  local_58 = pcVar14;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,local_50);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  puVar11 = (this->passes).
            super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar15 = (this->passes).
            super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 == puVar15) {
    pPVar12 = (PassOptions *)0x0;
  }
  else {
    pPVar10 = (PassOptions *)0x0;
    puVar5 = puVar11;
    do {
      pPVar12 = (PassOptions *)
                (((puVar5->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                  ._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name)._M_string_length;
      if (pPVar12 < pPVar10) {
        pPVar12 = pPVar10;
      }
      pPVar10 = pPVar12;
      puVar5 = puVar5 + 1;
      pPVar12 = pPVar10;
    } while (puVar5 != puVar15);
  }
  local_40 = &this->options;
  if ((2 < run::passDebug) && (this->isNested == false)) {
    sVar18 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xdf9875),SUB81(pPVar10,0));
    pPVar10 = local_40;
    dumpWasm((Name)sVar18,this->wasm,local_40);
    puVar11 = (this->passes).
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar15 = (this->passes).
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar11 == puVar15) {
    local_48 = 0.0;
  }
  else {
    local_48 = 0.0;
    local_60 = puVar15;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)auStack_398);
      if ((run::passDebug == 2) && (this->isNested == false)) {
        poVar6 = std::operator<<((ostream *)local_388,this->wasm);
        local_210[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_210,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[PassRunner]   running pass: ",0x1d);
      pPVar2 = (puVar11->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(pPVar2->name)._M_dataplus._M_p,
                          (pPVar2->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"... ",4);
      if (pPVar12 !=
          (PassOptions *)
          (((puVar11->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t
            .super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name)._M_string_length) {
        uVar16 = 0;
        do {
          local_210[0] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_210,1);
          uVar16 = uVar16 + 1;
          pPVar10 = (PassOptions *)
                    ((long)pPVar12 -
                    (((puVar11->_M_t).
                      super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name).
                    _M_string_length);
        } while (uVar16 < pPVar10);
      }
      lVar7 = std::chrono::_V2::steady_clock::now();
      iVar4 = (*((puVar11->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                 ._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[4])();
      if ((char)iVar4 == '\0') {
        runPass(local_38,(puVar11->_M_t).
                         super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                         super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                         super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl);
      }
      else {
        puVar3 = (local_38->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar13 = (local_38->wasm->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar3;
            puVar13 = puVar13 + 1) {
          func = (puVar13->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
            runPassOnFunction(local_38,(puVar11->_M_t).
                                       super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                       .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl,func
                             );
          }
        }
      }
      lVar8 = std::chrono::_V2::steady_clock::now();
      local_68 = (double)(lVar8 - lVar7) / 1000000000.0;
      poVar6 = std::ostream::_M_insert<double>(local_68);
      this = local_38;
      puVar15 = local_60;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," seconds.",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (((this->options).validate == true) && (this->isNested == false)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"[PassRunner]   (validating)\n",0x1c);
        bVar17 = WasmValidator::validate((WasmValidator *)local_210,this->wasm,local_40);
        if (!bVar17) {
          poVar6 = std::operator<<((ostream *)&std::cout,this->wasm);
          local_210[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_210,1);
          if (run::passDebug < 2) {
            Fatal::Fatal((Fatal *)local_210);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&flush.this,"Last pass (",0xb);
            pPVar2 = (puVar11->_M_t).
                     super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                     super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&flush.this,(pPVar2->name)._M_dataplus._M_p,
                       (pPVar2->name)._M_string_length);
            Fatal::operator<<((Fatal *)local_210,
                              (char (*) [128])
                              ") broke validation. Run with BINARYEN_PASS_DEBUG=2 in the env to see the earlier state, or 3 to dump byn-* files for each pass\n"
                             );
          }
          else {
            Fatal::Fatal((Fatal *)local_210);
            ppPVar1 = &flush.this;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppPVar1,"Last pass (",0xb)
            ;
            pPVar2 = (puVar11->_M_t).
                     super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                     super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppPVar1,(pPVar2->name)._M_dataplus._M_p,
                       (pPVar2->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppPVar1,") broke validation. Here is the module before: \n",0x30);
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppPVar1,(char *)local_88._M_head_impl,local_80);
            Fatal::operator<<((Fatal *)local_210,(char (*) [2])0xe3236f);
            std::__cxx11::string::~string((string *)&local_88);
          }
          Fatal::~Fatal((Fatal *)local_210);
        }
      }
      if (2 < run::passDebug) {
        pPVar2 = (puVar11->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                 ._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
        sVar18._M_str = (char *)0x0;
        sVar18._M_len = (size_t)(pPVar2->name)._M_dataplus._M_p;
        sVar18 = IString::interned((IString *)(pPVar2->name)._M_string_length,sVar18,
                                   SUB81(pPVar10,0));
        pPVar10 = local_40;
        dumpWasm((Name)sVar18,this->wasm,local_40);
      }
      local_48 = local_48 + local_68;
      std::__cxx11::stringstream::~stringstream((stringstream *)auStack_398);
      std::ios_base::~ios_base(local_318);
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[PassRunner] ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," took ",6);
  poVar6 = std::ostream::_M_insert<double>(local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," seconds.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (((this->options).validate != false) && (this->isNested == false)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[PassRunner] (final validation)\n",0x20);
    bVar17 = WasmValidator::validate((WasmValidator *)auStack_398,this->wasm,local_40);
    if (!bVar17) {
      poVar6 = std::operator<<((ostream *)&std::cout,this->wasm);
      auStack_398[0] = (stringstream)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,auStack_398,1);
      Fatal::Fatal((Fatal *)auStack_398);
      Fatal::operator<<((Fatal *)auStack_398,(char (*) [32])"final module does not validate\n");
      Fatal::~Fatal((Fatal *)auStack_398);
    }
  }
  return;
}

Assistant:

void PassRunner::run() {
  static const int passDebug = getPassDebug();
  // Emit logging information when asked for. At passDebug level 1+ we log
  // the main passes, while in 2 we also log nested ones. Note that for
  // nested ones we can only emit their name - we can't validate, or save the
  // file, or print, as the wasm may be in an intermediate state that is not
  // valid.
  if (options.debug || (passDebug == 2 || (passDebug && !isNested))) {
    // for debug logging purposes, run each pass in full before running the
    // other
    auto totalTime = std::chrono::duration<double>(0);
    auto what = isNested ? "nested passes" : "passes";
    std::cerr << "[PassRunner] running " << what << std::endl;
    size_t padding = 0;
    for (auto& pass : passes) {
      padding = std::max(padding, pass->name.size());
    }
    if (passDebug >= 3 && !isNested) {
      dumpWasm("before", wasm, options);
    }
    for (auto& pass : passes) {
      // ignoring the time, save a printout of the module before, in case this
      // pass breaks it, so we can print the before and after
      std::stringstream moduleBefore;
      if (passDebug == 2 && !isNested) {
        moduleBefore << *wasm << '\n';
      }
      // prepare to run
      std::cerr << "[PassRunner]   running pass: " << pass->name << "... ";
      for (size_t i = 0; i < padding - pass->name.size(); i++) {
        std::cerr << ' ';
      }
      auto before = std::chrono::steady_clock::now();
      if (pass->isFunctionParallel()) {
        // function-parallel passes should get a new instance per function
        ModuleUtils::iterDefinedFunctions(
          *wasm, [&](Function* func) { runPassOnFunction(pass.get(), func); });
      } else {
        runPass(pass.get());
      }
      auto after = std::chrono::steady_clock::now();
      std::chrono::duration<double> diff = after - before;
      std::cerr << diff.count() << " seconds." << std::endl;
      totalTime += diff;
      if (options.validate && !isNested) {
        // validate, ignoring the time
        std::cerr << "[PassRunner]   (validating)\n";
        if (!WasmValidator().validate(*wasm, options)) {
          std::cout << *wasm << '\n';
          if (passDebug >= 2) {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Here is the module before: \n"
                    << moduleBefore.str() << "\n";
          } else {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Run with BINARYEN_PASS_DEBUG=2 "
                       "in the env to see the earlier state, or 3 to dump "
                       "byn-* files for each pass\n";
          }
        }
      }
      if (passDebug >= 3) {
        dumpWasm(pass->name, wasm, options);
      }
    }
    std::cerr << "[PassRunner] " << what << " took " << totalTime.count()
              << " seconds." << std::endl;
    if (options.validate && !isNested) {
      std::cerr << "[PassRunner] (final validation)\n";
      if (!WasmValidator().validate(*wasm, options)) {
        std::cout << *wasm << '\n';
        Fatal() << "final module does not validate\n";
      }
    }
  } else {
    // non-debug normal mode, run them in an optimal manner - for locality it is
    // better to run as many passes as possible on a single function before
    // moving to the next
    std::vector<Pass*> stack;
    auto flush = [&]() {
      if (stack.size() > 0) {
        // run the stack of passes on all the functions, in parallel
        size_t num = ThreadPool::get()->size();
        std::vector<std::function<ThreadWorkState()>> doWorkers;
        std::atomic<size_t> nextFunction;
        nextFunction.store(0);
        size_t numFunctions = wasm->functions.size();
        for (size_t i = 0; i < num; i++) {
          doWorkers.push_back([&]() {
            auto index = nextFunction.fetch_add(1);
            // get the next task, if there is one
            if (index >= numFunctions) {
              return ThreadWorkState::Finished; // nothing left
            }
            Function* func = this->wasm->functions[index].get();
            if (!func->imported()) {
              // do the current task: run all passes on this function
              for (auto* pass : stack) {
                runPassOnFunction(pass, func);
              }
            }
            if (index + 1 == numFunctions) {
              return ThreadWorkState::Finished; // we did the last one
            }
            return ThreadWorkState::More;
          });
        }
        ThreadPool::get()->work(doWorkers);
      }
      stack.clear();
    };
    for (auto& pass : passes) {
      if (pass->isFunctionParallel()) {
        stack.push_back(pass.get());
      } else {
        flush();
        runPass(pass.get());
      }
    }
    flush();
  }
}